

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbiipas2_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  int iVar1;
  CPUState *cpu;
  target_ulong addr;
  uint64_t pageaddr;
  CPUState *cs;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  cpu = env_cpu(env);
  iVar1 = arm_feature(env,0x20);
  if ((iVar1 != 0) && (((env->cp15).scr_el3 & 1) != 0)) {
    addr = sextract64(value << 0xc,0,0x28);
    tlb_flush_page_by_mmuidx_aarch64(cpu,addr,0x800);
  }
  return;
}

Assistant:

static void tlbiipas2_write(CPUARMState *env, const ARMCPRegInfo *ri,
                            uint64_t value)
{
    /* Invalidate by IPA. This has to invalidate any structures that
     * contain only stage 2 translation information, but does not need
     * to apply to structures that contain combined stage 1 and stage 2
     * translation information.
     * This must NOP if EL2 isn't implemented or SCR_EL3.NS is zero.
     */
    CPUState *cs = env_cpu(env);
    uint64_t pageaddr;

    if (!arm_feature(env, ARM_FEATURE_EL2) || !(env->cp15.scr_el3 & SCR_NS)) {
        return;
    }

    pageaddr = sextract64(value << 12, 0, 40);

    tlb_flush_page_by_mmuidx(cs, pageaddr, ARMMMUIdxBit_Stage2);
}